

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O2

idx_t duckdb::VectorStringToList::CountPartsList(string_t *input)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  idx_t iVar5;
  idx_t pos;
  optional_idx start_pos;
  idx_t len;
  idx_t end_pos;
  StringCastInputState input_state;
  idx_t local_70;
  optional_idx local_68;
  ulong local_60;
  idx_t local_58;
  StringCastInputState local_50;
  
  local_60 = (ulong)(input->value).pointer.length;
  if (local_60 < 0xd) {
    pcVar3 = (input->value).pointer.prefix;
  }
  else {
    pcVar3 = (input->value).pointer.ptr;
  }
  local_50.len = &local_60;
  local_50.pos = &local_70;
  local_70 = 0;
  local_50.escaped = false;
  local_50.buf = pcVar3;
  SkipWhitespace(&local_50);
  if ((local_70 == local_60) || (pcVar3[local_70] != '[')) {
    iVar5 = 0;
  }
  else {
    local_70 = local_70 + 1;
    SkipWhitespace(&local_50);
    iVar5 = 0;
    bVar4 = false;
    while (local_70 < local_60) {
      local_68.index = 0xffffffffffffffff;
      while (((local_70 < local_60 && (pcVar3[local_70] != ',')) && (pcVar3[local_70] != ']'))) {
        bVar1 = ValueStateTransition(&local_50,&local_68,&local_58);
        if (!bVar1) {
          return iVar5;
        }
      }
      if (local_70 == local_60) {
        return iVar5;
      }
      cVar2 = pcVar3[local_70];
      if (cVar2 == ']') {
        if (local_68.index == 0xffffffffffffffff) {
          if (!bVar4) break;
        }
        else {
LAB_013b833e:
          optional_idx::GetIndex(&local_68);
          cVar2 = pcVar3[local_70];
        }
      }
      else if (local_68.index != 0xffffffffffffffff) goto LAB_013b833e;
      iVar5 = iVar5 + 1;
      if (cVar2 == ']') break;
      local_70 = local_70 + 1;
      SkipWhitespace(&local_50);
      bVar4 = true;
    }
    local_70 = local_70 + 1;
    SkipWhitespace(&local_50);
  }
  return iVar5;
}

Assistant:

idx_t VectorStringToList::CountPartsList(const string_t &input) {
	CountPartOperation state;
	SplitStringListInternal<CountPartOperation>(input, state);
	return state.count;
}